

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O1

Matrix<float,_3,_2> *
tcu::operator+(Matrix<float,_3,_2> *__return_storage_ptr__,Matrix<float,_3,_2> *a,
              Matrix<float,_3,_2> *b)

{
  Vector<float,_3> *pVVar1;
  Matrix<float,_3,_2> *pMVar2;
  long lVar3;
  Matrix<float,_3,_2> *res;
  int row_1;
  float *pfVar4;
  int row;
  long lVar5;
  long lVar6;
  bool bVar7;
  undefined4 uVar8;
  
  pMVar2 = __return_storage_ptr__;
  (__return_storage_ptr__->m_data).m_data[0].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[1] = 0.0;
  *(undefined8 *)((__return_storage_ptr__->m_data).m_data[0].m_data + 2) = 0;
  pVVar1 = (__return_storage_ptr__->m_data).m_data;
  pVVar1[1].m_data[1] = 0.0;
  pVVar1[1].m_data[2] = 0.0;
  lVar3 = 0;
  lVar5 = 0;
  pfVar4 = (float *)__return_storage_ptr__;
  do {
    lVar6 = 0;
    do {
      uVar8 = 0x3f800000;
      if (lVar3 != lVar6) {
        uVar8 = 0;
      }
      *(undefined4 *)((long)pfVar4 + lVar6) = uVar8;
      lVar6 = lVar6 + 0xc;
    } while (lVar6 == 0xc);
    lVar5 = lVar5 + 1;
    pfVar4 = pfVar4 + 1;
    lVar3 = lVar3 + 0xc;
  } while (lVar5 != 3);
  lVar3 = 0;
  do {
    lVar5 = 0;
    do {
      ((Vector<tcu::Vector<float,_3>,_2> *)((Vector<float,_3> *)__return_storage_ptr__)->m_data)->
      m_data[0].m_data[lVar5] =
           ((Vector<tcu::Vector<float,_3>,_2> *)((Vector<float,_3> *)a)->m_data)->m_data[0].m_data
           [lVar5] + ((Vector<tcu::Vector<float,_3>,_2> *)((Vector<float,_3> *)b)->m_data)->m_data
                     [0].m_data[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 3);
    __return_storage_ptr__ = (Matrix<float,_3,_2> *)((long)__return_storage_ptr__ + 0xc);
    b = (Matrix<float,_3,_2> *)((long)b + 0xc);
    a = (Matrix<float,_3,_2> *)((long)a + 0xc);
    bVar7 = lVar3 == 0;
    lVar3 = lVar3 + 1;
  } while (bVar7);
  return pMVar2;
}

Assistant:

Matrix<T, Rows, Cols> operator+ (const Matrix<T, Rows, Cols>& a, const Matrix<T, Rows, Cols>& b)
{
	Matrix<T, Rows, Cols> res;
	for (int col = 0; col < Cols; col++)
		for (int row = 0; row < Rows; row++)
			res(row, col) = a(row, col) + b(row, col);
	return res;
}